

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

bool __thiscall QGles2GraphicsPipeline::create(QGles2GraphicsPipeline *this)

{
  ActiveUniformLocationTracker *pAVar1;
  bool bVar2;
  bool bVar3;
  GLenum GVar4;
  GLuint GVar5;
  anon_enum_32 aVar6;
  Variant svar;
  ProgramCacheResult PVar7;
  const_iterator pQVar8;
  QRhiGles2 *this_00;
  size_type sVar9;
  InOutVariable *pIVar10;
  iterator o;
  iterator pQVar11;
  char *pcVar12;
  undefined4 uVar13;
  long *in_RDI;
  undefined1 *puVar14;
  long in_FS_OFFSET;
  SeparateToCombinedImageSamplerMapping *mapping;
  SeparateToCombinedImageSamplerMappingList *__range3_2;
  InOutVariable *v;
  QList<QShaderDescription::InOutVariable> *__range3_1;
  UniformBlock *ub;
  QList<QShaderDescription::UniformBlock> *__range3;
  int idx_1;
  QRhiShaderStage *shaderStage_2;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  add_const_t<QVarLengthArray<QRhiShaderStage,_4LL>_> *__range1_1;
  InOutVariable *inVar;
  QList<QShaderDescription::InOutVariable> *__range2_1;
  QRhiShaderStage *shaderStage_1;
  const_iterator __end2;
  const_iterator __begin2;
  add_const_t<QVarLengthArray<QRhiShaderStage,_4LL>_> *__range2;
  ProgramCacheResult cacheResult;
  int idx;
  QRhiShaderStage *shaderStage;
  const_iterator __end1;
  const_iterator __begin1;
  add_const_t<QVarLengthArray<QRhiShaderStage,_4LL>_> *__range1;
  bool vertexFragmentOnly;
  QRhiGles2 *rhiD;
  iterator __end3_2;
  iterator __begin3_2;
  iterator __end3_1;
  iterator __begin3_1;
  iterator __end3;
  iterator __begin3;
  iterator __end2_1;
  iterator __begin2_1;
  QByteArray cacheKey;
  QShaderVersion shaderVersion;
  QShader shader;
  anon_class_1_0_00000001 descIdxForStage;
  ActiveUniformLocationTracker activeUniformLocations;
  SeparateToCombinedImageSamplerMappingList samplerMappingList [5];
  QShaderDescription desc [5];
  GLuint in_stack_fffffffffffff7e8;
  Flag in_stack_fffffffffffff7ec;
  undefined4 in_stack_fffffffffffff7f0;
  GLuint in_stack_fffffffffffff7f4;
  QRhiGles2 *in_stack_fffffffffffff7f8;
  undefined1 **ppuVar15;
  QRhiGles2 *in_stack_fffffffffffff800;
  undefined1 **ppuVar16;
  QRhiGles2 *in_stack_fffffffffffff808;
  QRhiGraphicsPipeline *in_stack_fffffffffffff810;
  QRhiImplementation *in_stack_fffffffffffff818;
  undefined1 uVar18;
  undefined1 *puVar17;
  QByteArray *in_stack_fffffffffffff820;
  undefined4 in_stack_fffffffffffff828;
  GLuint in_stack_fffffffffffff82c;
  QRhiGles2 *in_stack_fffffffffffff830;
  code *pcVar19;
  QRhiShaderStage *in_stack_fffffffffffff838;
  QRhiGles2 *in_stack_fffffffffffff840;
  undefined4 in_stack_fffffffffffff848;
  int in_stack_fffffffffffff84c;
  ActiveUniformLocationTracker *activeUniformLocations_00;
  undefined4 in_stack_fffffffffffff868;
  uint in_stack_fffffffffffff86c;
  undefined1 *local_780;
  undefined1 **local_768;
  const_iterator local_708;
  const_iterator local_6d8;
  QRhiShaderStage *local_6a8;
  bool local_679;
  iterator local_668;
  InOutVariable *local_660;
  iterator local_658;
  iterator local_650 [4];
  UniformBlock *local_630;
  iterator local_628;
  iterator local_620 [4];
  InOutVariable *local_600;
  iterator local_5f8;
  iterator local_5f0 [7];
  undefined1 *local_5b8;
  undefined1 *local_5b0;
  undefined1 *local_5a8;
  QShaderKey local_5a0 [4];
  QShaderVersion local_558;
  undefined1 *local_550;
  undefined1 local_541;
  undefined1 local_540 [1160];
  undefined1 local_b8 [120];
  undefined1 auStack_40 [8];
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pAVar1 = (ActiveUniformLocationTracker *)in_RDI[1];
  if ((int)in_RDI[0x6c] != 0) {
    (**(code **)(*in_RDI + 0x18))();
  }
  bVar2 = QRhiGles2::ensureContext(in_stack_fffffffffffff800,(QSurface *)in_stack_fffffffffffff7f8);
  if (!bVar2) {
    local_679 = false;
    goto LAB_00931edb;
  }
  QRhiImplementation::pipelineCreationStart((QRhiImplementation *)0x931036);
  bVar2 = QRhiImplementation::sanityCheckGraphicsPipeline
                    (in_stack_fffffffffffff818,in_stack_fffffffffffff810);
  if (!bVar2) {
    local_679 = false;
    goto LAB_00931edb;
  }
  GVar4 = toGlTopology(*(Topology *)((long)in_RDI + 0x34));
  *(GLenum *)((long)in_RDI + 0x364) = GVar4;
  GVar5 = QOpenGLFunctions::glCreateProgram
                    ((QOpenGLFunctions *)
                     CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
  *(GLuint *)(in_RDI + 0x6c) = GVar5;
  local_541 = 0xaa;
  memset(&local_38,0,0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_768 = &local_38;
  do {
    QShaderDescription::QShaderDescription
              ((QShaderDescription *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
    local_768 = local_768 + 1;
  } while (local_768 != &puStack_10);
  memset(local_b8,0xaa,0x78);
  local_780 = local_b8;
  do {
    QList<QShader::SeparateToCombinedImageSamplerMapping>::QList
              ((QList<QShader::SeparateToCombinedImageSamplerMapping> *)0x9311bb);
    local_780 = local_780 + 0x18;
  } while (local_780 != auStack_40);
  bVar2 = true;
  local_6a8 = QVLABase<QRhiShaderStage>::begin((QVLABase<QRhiShaderStage> *)0x931219);
  pQVar8 = QVLABase<QRhiShaderStage>::end
                     ((QVLABase<QRhiShaderStage> *)
                      CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
  for (; local_6a8 != pQVar8; local_6a8 = local_6a8 + 1) {
    bVar3 = isGraphicsStage((QRhiShaderStage *)
                            CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
    if (bVar3) {
      aVar6 = create::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)in_stack_fffffffffffff7f8,
                         (QRhiShaderStage *)
                         CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
      if ((aVar6 != VtxIdx) && (aVar6 != FragIdx)) {
        bVar2 = false;
      }
      local_550 = &DAT_aaaaaaaaaaaaaaaa;
      QRhiShaderStage::shader
                ((QRhiShaderStage *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
      local_558 = (QShaderVersion)&DAT_aaaaaaaaaaaaaaaa;
      QShaderVersion::QShaderVersion((QShaderVersion *)0x9312fc);
      QShader::description((QShader *)in_stack_fffffffffffff7f8);
      QShaderDescription::operator=
                ((QShaderDescription *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0)
                 ,(QShaderDescription *)
                  CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
      QShaderDescription::~QShaderDescription
                ((QShaderDescription *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0)
                );
      QRhiGles2::shaderSource
                (in_stack_fffffffffffff840,in_stack_fffffffffffff838,
                 (QShaderVersion *)in_stack_fffffffffffff830);
      bVar3 = QByteArray::isEmpty((QByteArray *)0x931374);
      in_stack_fffffffffffff86c = CONCAT13(bVar3,(int3)in_stack_fffffffffffff86c) ^ 0xff000000;
      QByteArray::~QByteArray((QByteArray *)0x93138a);
      if ((in_stack_fffffffffffff86c & 0x1000000) != 0) {
        svar = QRhiShaderStage::shaderVariant(local_6a8);
        QShaderKey::QShaderKey(local_5a0,GlslShader,&local_558,svar);
        QShader::separateToCombinedImageSamplerMappingList
                  ((QShader *)in_stack_fffffffffffff800,(QShaderKey *)in_stack_fffffffffffff7f8);
        QList<QShader::SeparateToCombinedImageSamplerMapping>::operator=
                  ((QList<QShader::SeparateToCombinedImageSamplerMapping> *)
                   CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                   (QList<QShader::SeparateToCombinedImageSamplerMapping> *)
                   CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
        QList<QShader::SeparateToCombinedImageSamplerMapping>::~QList
                  ((QList<QShader::SeparateToCombinedImageSamplerMapping> *)0x93140e);
      }
      QShader::~QShader((QShader *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
    }
  }
  local_5b8 = &DAT_aaaaaaaaaaaaaaaa;
  local_5b0 = &DAT_aaaaaaaaaaaaaaaa;
  local_5a8 = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)0x931470);
  activeUniformLocations_00 = pAVar1;
  this_00 = (QRhiGles2 *)
            QVarLengthArray<QRhiShaderStage,_4LL>::constData
                      ((QVarLengthArray<QRhiShaderStage,_4LL> *)0x931491);
  sVar9 = QVLABaseBase::size((QVLABaseBase *)(in_RDI + 0x35));
  uVar13 = (undefined4)sVar9;
  GVar5 = *(GLuint *)(in_RDI + 0x6c);
  QShaderDescription::inputVariables
            ((QShaderDescription *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  PVar7 = QRhiGles2::tryLoadFromDiskOrPipelineCache
                    ((QRhiGles2 *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),
                     (QRhiShaderStage *)CONCAT44(GVar5,uVar13),(int)((ulong)this_00 >> 0x20),
                     (GLuint)this_00,
                     (QVector<QShaderDescription::InOutVariable> *)activeUniformLocations_00,
                     (QByteArray *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
  QList<QShaderDescription::InOutVariable>::~QList
            ((QList<QShaderDescription::InOutVariable> *)0x931513);
  if (PVar7 == ProgramCacheError) {
    local_679 = false;
  }
  else {
    if (PVar7 == ProgramCacheMiss) {
      local_6d8 = QVLABase<QRhiShaderStage>::begin((QVLABase<QRhiShaderStage> *)0x931586);
      pQVar8 = QVLABase<QRhiShaderStage>::end
                         ((QVLABase<QRhiShaderStage> *)
                          CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
      for (; local_6d8 != pQVar8; local_6d8 = local_6d8 + 1) {
        bVar3 = isGraphicsStage((QRhiShaderStage *)
                                CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
        if ((bVar3) &&
           (bVar3 = QRhiGles2::compileShader
                              (this_00,(GLuint)((ulong)activeUniformLocations_00 >> 0x20),
                               (QRhiShaderStage *)
                               CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                               (QShaderVersion *)in_stack_fffffffffffff840), !bVar3)) {
          local_679 = false;
          goto LAB_00931e52;
        }
      }
      QShaderDescription::inputVariables
                ((QShaderDescription *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8)
                );
      local_5f0[0].i = (InOutVariable *)&DAT_aaaaaaaaaaaaaaaa;
      local_5f0[0] = QList<QShaderDescription::InOutVariable>::begin
                               ((QList<QShaderDescription::InOutVariable> *)
                                CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
      local_5f8.i = (InOutVariable *)&DAT_aaaaaaaaaaaaaaaa;
      local_5f8 = QList<QShaderDescription::InOutVariable>::end
                            ((QList<QShaderDescription::InOutVariable> *)
                             CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
      while( true ) {
        local_600 = local_5f8.i;
        bVar3 = QList<QShaderDescription::InOutVariable>::iterator::operator!=(local_5f0,local_5f8);
        if (!bVar3) break;
        pIVar10 = QList<QShaderDescription::InOutVariable>::iterator::operator*(local_5f0);
        in_stack_fffffffffffff848 = (undefined4)in_RDI[0x6c];
        in_stack_fffffffffffff84c = pIVar10->location;
        QByteArray::operator_cast_to_char_((QByteArray *)0x93177f);
        QOpenGLFunctions::glBindAttribLocation
                  ((QOpenGLFunctions *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0)
                   ,in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8,(char *)0x931794);
        QList<QShaderDescription::InOutVariable>::iterator::operator++(local_5f0);
      }
      QList<QShaderDescription::InOutVariable>::~QList
                ((QList<QShaderDescription::InOutVariable> *)0x93170e);
      if (bVar2) {
        QRhiGles2::sanityCheckVertexFragmentInterface
                  ((QRhiGles2 *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                   (QShaderDescription *)in_stack_fffffffffffff820,
                   (QShaderDescription *)in_stack_fffffffffffff818);
      }
      uVar18 = (undefined1)((ulong)in_stack_fffffffffffff818 >> 0x38);
      bVar2 = QRhiGles2::linkProgram
                        (in_stack_fffffffffffff808,
                         (GLuint)((ulong)in_stack_fffffffffffff800 >> 0x20));
      if (!bVar2) {
        local_679 = false;
        goto LAB_00931e52;
      }
      bVar2 = QFlags<QRhi::Flag>::testFlag
                        ((QFlags<QRhi::Flag> *)
                         CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                         in_stack_fffffffffffff7ec);
      if (bVar2) {
        QRhiGles2::trySaveToPipelineCache
                  (in_stack_fffffffffffff830,in_stack_fffffffffffff82c,in_stack_fffffffffffff820,
                   (bool)uVar18);
      }
      QRhiGles2::trySaveToDiskCache
                (in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f4,
                 (QByteArray *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    }
    else {
      bVar2 = QFlags<QRhi::Flag>::testFlag
                        ((QFlags<QRhi::Flag> *)
                         CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                         in_stack_fffffffffffff7ec);
      if (bVar2) {
        QRhiGles2::trySaveToPipelineCache
                  (in_stack_fffffffffffff830,in_stack_fffffffffffff82c,in_stack_fffffffffffff820,
                   SUB81((ulong)in_stack_fffffffffffff818 >> 0x38,0));
      }
    }
    memcpy(local_540,&DAT_00bdeec8,0x488);
    QDuplicateTracker<int,_32UL>::QDuplicateTracker
              ((QDuplicateTracker<int,_32UL> *)in_stack_fffffffffffff800);
    local_708 = QVLABase<QRhiShaderStage>::begin((QVLABase<QRhiShaderStage> *)0x931915);
    pQVar8 = QVLABase<QRhiShaderStage>::end
                       ((QVLABase<QRhiShaderStage> *)
                        CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
    for (; local_708 != pQVar8; local_708 = local_708 + 1) {
      bVar2 = isGraphicsStage((QRhiShaderStage *)
                              CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
      if (bVar2) {
        create::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)in_stack_fffffffffffff7f8,
                   (QRhiShaderStage *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0))
        ;
        QShaderDescription::uniformBlocks
                  ((QShaderDescription *)
                   CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
        local_620[0].i = (UniformBlock *)&DAT_aaaaaaaaaaaaaaaa;
        local_620[0] = QList<QShaderDescription::UniformBlock>::begin
                                 ((QList<QShaderDescription::UniformBlock> *)
                                  CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
        local_628.i = (UniformBlock *)&DAT_aaaaaaaaaaaaaaaa;
        local_628 = QList<QShaderDescription::UniformBlock>::end
                              ((QList<QShaderDescription::UniformBlock> *)
                               CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
        while( true ) {
          local_630 = local_628.i;
          bVar2 = QList<QShaderDescription::UniformBlock>::iterator::operator!=(local_620,local_628)
          ;
          if (!bVar2) break;
          QList<QShaderDescription::UniformBlock>::iterator::operator*(local_620);
          QRhiGles2::gatherUniforms
                    ((QRhiGles2 *)CONCAT44(in_stack_fffffffffffff86c,PVar7),GVar5,
                     (UniformBlock *)this_00,activeUniformLocations_00,
                     (QGles2UniformDescriptionVector *)
                     CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848));
          QList<QShaderDescription::UniformBlock>::iterator::operator++(local_620);
        }
        QList<QShaderDescription::UniformBlock>::~QList
                  ((QList<QShaderDescription::UniformBlock> *)0x931a6b);
        QShaderDescription::combinedImageSamplers
                  ((QShaderDescription *)
                   CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
        local_650[0].i = (InOutVariable *)&DAT_aaaaaaaaaaaaaaaa;
        local_650[0] = QList<QShaderDescription::InOutVariable>::begin
                                 ((QList<QShaderDescription::InOutVariable> *)
                                  CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
        local_658.i = (InOutVariable *)&DAT_aaaaaaaaaaaaaaaa;
        local_658 = QList<QShaderDescription::InOutVariable>::end
                              ((QList<QShaderDescription::InOutVariable> *)
                               CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
        while( true ) {
          local_660 = local_658.i;
          bVar2 = QList<QShaderDescription::InOutVariable>::iterator::operator!=
                            (local_650,local_658);
          if (!bVar2) break;
          QList<QShaderDescription::InOutVariable>::iterator::operator*(local_650);
          QRhiGles2::gatherSamplers
                    (in_stack_fffffffffffff808,(GLuint)((ulong)in_stack_fffffffffffff800 >> 0x20),
                     (InOutVariable *)in_stack_fffffffffffff7f8,
                     (QGles2SamplerDescriptionVector *)
                     CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
          QList<QShaderDescription::InOutVariable>::iterator::operator++(local_650);
        }
        QList<QShaderDescription::InOutVariable>::~QList
                  ((QList<QShaderDescription::InOutVariable> *)0x931ba8);
        local_668.i = (SeparateToCombinedImageSamplerMapping *)&DAT_aaaaaaaaaaaaaaaa;
        local_668 = QList<QShader::SeparateToCombinedImageSamplerMapping>::begin
                              ((QList<QShader::SeparateToCombinedImageSamplerMapping> *)
                               CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
        o = QList<QShader::SeparateToCombinedImageSamplerMapping>::end
                      ((QList<QShader::SeparateToCombinedImageSamplerMapping> *)
                       CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
        while (bVar2 = QList<QShader::SeparateToCombinedImageSamplerMapping>::iterator::operator!=
                                 (&local_668,o), bVar2) {
          QList<QShader::SeparateToCombinedImageSamplerMapping>::iterator::operator*(&local_668);
          QRhiGles2::gatherGeneratedSamplers
                    (in_stack_fffffffffffff808,(GLuint)((ulong)in_stack_fffffffffffff800 >> 0x20),
                     (SeparateToCombinedImageSamplerMapping *)in_stack_fffffffffffff7f8,
                     (QGles2SamplerDescriptionVector *)
                     CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
          QList<QShader::SeparateToCombinedImageSamplerMapping>::iterator::operator++(&local_668);
        }
      }
    }
    pQVar11 = QVLABase<QGles2UniformDescription>::begin
                        ((QVLABase<QGles2UniformDescription> *)0x931d45);
    uVar18 = (undefined1)((ulong)in_stack_fffffffffffff800 >> 0x38);
    QVLABase<QGles2UniformDescription>::end
              ((QVLABase<QGles2UniformDescription> *)
               CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
    std::sort<QGles2UniformDescription*,QGles2GraphicsPipeline::create()::__1>(pQVar11);
    memset(in_RDI + 0x93,0,0x5000);
    in_RDI[0xa93] = 0;
    *(undefined4 *)(in_RDI + 0xa94) = 0;
    if (*(long *)((long)((DataPointer *)pAVar1->buffer + 0x14) + 0x10) != 0) {
      pcVar19 = *(code **)((long)((DataPointer *)pAVar1->buffer + 0x14) + 0x10);
      uVar13 = (undefined4)in_RDI[0x6c];
      pcVar12 = QByteArray::constData((QByteArray *)0x931de4);
      (*pcVar19)(0x82e2,uVar13,0xffffffff,pcVar12);
    }
    QRhiImplementation::pipelineCreationEnd
              ((QRhiImplementation *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
    *(int *)(in_RDI + 0xa95) = (int)in_RDI[0xa95] + 1;
    QRhiImplementation::registerResource
              (&in_stack_fffffffffffff7f8->super_QRhiImplementation,
               (QRhiResource *)in_stack_fffffffffffff808,(bool)uVar18);
    local_679 = true;
    QDuplicateTracker<int,_32UL>::~QDuplicateTracker
              ((QDuplicateTracker<int,_32UL> *)
               CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
  }
LAB_00931e52:
  QByteArray::~QByteArray((QByteArray *)0x931e5f);
  puVar17 = local_b8;
  puVar14 = auStack_40;
  do {
    puVar14 = puVar14 + -0x18;
    QList<QShader::SeparateToCombinedImageSamplerMapping>::~QList
              ((QList<QShader::SeparateToCombinedImageSamplerMapping> *)0x931e88);
  } while (puVar14 != puVar17);
  ppuVar16 = &local_38;
  ppuVar15 = &puStack_10;
  do {
    ppuVar15 = ppuVar15 + -1;
    QShaderDescription::~QShaderDescription
              ((QShaderDescription *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
  } while (ppuVar15 != ppuVar16);
LAB_00931edb:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_679;
}

Assistant:

bool QGles2GraphicsPipeline::create()
{
    QRHI_RES_RHI(QRhiGles2);

    if (program)
        destroy();

    if (!rhiD->ensureContext())
        return false;

    rhiD->pipelineCreationStart();
    if (!rhiD->sanityCheckGraphicsPipeline(this))
        return false;

    drawMode = toGlTopology(m_topology);

    program = rhiD->f->glCreateProgram();

    enum {
        VtxIdx = 0,
        TCIdx,
        TEIdx,
        GeomIdx,
        FragIdx,
        LastIdx
    };
    const auto descIdxForStage = [](const QRhiShaderStage &shaderStage) {
        switch (shaderStage.type()) {
        case QRhiShaderStage::Vertex:
            return VtxIdx;
        case QRhiShaderStage::TessellationControl:
            return TCIdx;
        case QRhiShaderStage::TessellationEvaluation:
            return TEIdx;
        case QRhiShaderStage::Geometry:
            return GeomIdx;
        case QRhiShaderStage::Fragment:
            return FragIdx;
        default:
            break;
        }
        Q_UNREACHABLE_RETURN(VtxIdx);
    };
    QShaderDescription desc[LastIdx];
    QShader::SeparateToCombinedImageSamplerMappingList samplerMappingList[LastIdx];
    bool vertexFragmentOnly = true;
    for (const QRhiShaderStage &shaderStage : std::as_const(m_shaderStages)) {
        if (isGraphicsStage(shaderStage)) {
            const int idx = descIdxForStage(shaderStage);
            if (idx != VtxIdx && idx != FragIdx)
                vertexFragmentOnly = false;
            QShader shader = shaderStage.shader();
            QShaderVersion shaderVersion;
            desc[idx] = shader.description();
            if (!rhiD->shaderSource(shaderStage, &shaderVersion).isEmpty()) {
                samplerMappingList[idx] = shader.separateToCombinedImageSamplerMappingList(
                            { QShader::GlslShader, shaderVersion, shaderStage.shaderVariant() });
            }
        }
    }

    QByteArray cacheKey;
    QRhiGles2::ProgramCacheResult cacheResult = rhiD->tryLoadFromDiskOrPipelineCache(m_shaderStages.constData(),
                                                                                     m_shaderStages.size(),
                                                                                     program,
                                                                                     desc[VtxIdx].inputVariables(),
                                                                                     &cacheKey);
    if (cacheResult == QRhiGles2::ProgramCacheError)
        return false;

    if (cacheResult == QRhiGles2::ProgramCacheMiss) {
        for (const QRhiShaderStage &shaderStage : std::as_const(m_shaderStages)) {
            if (isGraphicsStage(shaderStage)) {
                if (!rhiD->compileShader(program, shaderStage, nullptr))
                    return false;
            }
        }

        // important when GLSL <= 150 is used that does not have location qualifiers
        for (const QShaderDescription::InOutVariable &inVar : desc[VtxIdx].inputVariables())
            rhiD->f->glBindAttribLocation(program, GLuint(inVar.location), inVar.name);

        if (vertexFragmentOnly)
            rhiD->sanityCheckVertexFragmentInterface(desc[VtxIdx], desc[FragIdx]);

        if (!rhiD->linkProgram(program))
            return false;

        if (rhiD->rhiFlags.testFlag(QRhi::EnablePipelineCacheDataSave)) {
            // force replacing existing cache entry (if there is one, then
            // something is wrong with it, as there was no hit)
            rhiD->trySaveToPipelineCache(program, cacheKey, true);
        }
        // legacy QOpenGLShaderProgram style behavior: do this always, even
        // though it is superfluous with the "pipeline cache" enabled. Continue
        // storing to the Qt 5 style individual-file disk cache, because there
        // is no guarantee one retrieves the "pipeline cache" blob and writes it
        // out. Classic example: if Qt Quick only retrieves and stores the
        // combined cache contents when exiting, applications that never exit
        // cleanly (because they are killed, Ctrl+C'd, etc.) never store any
        // program binaries! Therefore, to maintain Qt 5 behavioral
        // compatibility, continue writing out the individual files no matter
        // what.
        rhiD->trySaveToDiskCache(program, cacheKey);
    } else {
        Q_ASSERT(cacheResult == QRhiGles2::ProgramCacheHit);
        if (rhiD->rhiFlags.testFlag(QRhi::EnablePipelineCacheDataSave)) {
            // just so that it ends up in the pipeline cache also when the hit was
            // from the disk cache
            rhiD->trySaveToPipelineCache(program, cacheKey);
        }
    }

    // Use the same work area for the vertex & fragment stages, thus ensuring
    // that we will not do superfluous glUniform calls for uniforms that are
    // present in both shaders.
    QRhiGles2::ActiveUniformLocationTracker activeUniformLocations;

    for (const QRhiShaderStage &shaderStage : std::as_const(m_shaderStages)) {
        if (isGraphicsStage(shaderStage)) {
            const int idx = descIdxForStage(shaderStage);
            for (const QShaderDescription::UniformBlock &ub : desc[idx].uniformBlocks())
                rhiD->gatherUniforms(program, ub, &activeUniformLocations, &uniforms);
            for (const QShaderDescription::InOutVariable &v : desc[idx].combinedImageSamplers())
                rhiD->gatherSamplers(program, v, &samplers);
            for (const QShader::SeparateToCombinedImageSamplerMapping &mapping : samplerMappingList[idx])
                rhiD->gatherGeneratedSamplers(program, mapping, &samplers);
        }
    }

    std::sort(uniforms.begin(), uniforms.end(),
              [](const QGles2UniformDescription &a, const QGles2UniformDescription &b)
    {
        return a.offset < b.offset;
    });

    memset(uniformState, 0, sizeof(uniformState));

    currentSrb = nullptr;
    currentSrbGeneration = 0;

    if (rhiD->glObjectLabel)
        rhiD->glObjectLabel(GL_PROGRAM, program, -1, m_objectName.constData());

    rhiD->pipelineCreationEnd();
    generation += 1;
    rhiD->registerResource(this);
    return true;
}